

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

void __thiscall clipp::parser::clean_miss_candidates_for(parser *this,dfs_traverser *match)

{
  reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>_>
  i;
  pointer local_28;
  reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>_>
  local_20;
  __normal_iterator<clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>
  local_18;
  
  local_20.current._M_current =
       (__normal_iterator<clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>
        )(this->missCand_).
         super__Vector_base<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  local_28 = (this->missCand_).
             super__Vector_base<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
             ._M_impl.super__Vector_impl_data._M_start;
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::miss_candidate*,std::vector<clipp::parser::miss_candidate,std::allocator<clipp::parser::miss_candidate>>>>,clipp::parser::clean_miss_candidates_for(clipp::group::depth_first_traverser_const&)::_lambda(clipp::parser::miss_candidate_const&)_1_>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>_>
              *)&local_18,&local_20,(dfs_traverser *)&local_28);
  if (local_18._M_current !=
      (this->missCand_).
      super__Vector_base<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>::
    erase(&this->missCand_,local_18._M_current + -1);
  }
  return;
}

Assistant:

void clean_miss_candidates_for(const dfs_traverser& match)
    {
        auto i = std::find_if(missCand_.rbegin(), missCand_.rend(),
            [&](const miss_candidate& m) {
                return &(*m.pos) == &(*match);
            });

        if(i != missCand_.rend()) {
            missCand_.erase(prev(i.base()));
        }
    }